

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::ChromeLatencyInfo::~ChromeLatencyInfo(ChromeLatencyInfo *this)

{
  ~ChromeLatencyInfo(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

ChromeLatencyInfo::~ChromeLatencyInfo() = default;